

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

void polyscope::anon_unknown_1::buildErrorUI(string *message,bool fatal)

{
  undefined1 auVar1 [16];
  bool bVar2;
  char *pcVar3;
  float *pfVar4;
  ImVec4 *col;
  undefined8 uVar5;
  byte in_SIL;
  ImVec2 name;
  undefined8 extraout_XMM0_Qb;
  float buttonOffset;
  float buttonWidth;
  bool doIndent;
  float offset;
  ImVec2 errorModalSize;
  ImVec2 errorTextSize;
  string errorPopupString;
  undefined4 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0c;
  undefined1 in_stack_ffffffffffffff0d;
  undefined1 in_stack_ffffffffffffff0e;
  bool bVar6;
  undefined1 in_stack_ffffffffffffff0f;
  char *in_stack_ffffffffffffff10;
  int count;
  undefined1 repeat;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  float indent_w;
  undefined8 in_stack_ffffffffffffff28;
  ImGuiWindowFlags flags;
  char *in_stack_ffffffffffffff30;
  ImVec2 *in_stack_ffffffffffffff38;
  undefined4 uStack_c0;
  ImGuiStyleVar in_stack_ffffffffffffff44;
  ImVec2 local_98;
  float local_90;
  float local_8c;
  float local_88;
  byte local_81;
  float local_80;
  float local_7c;
  ImVec4 local_78;
  float local_68;
  float local_64;
  float local_60;
  ImVec2 local_5c;
  undefined8 local_54;
  allocator local_39;
  string local_38 [8];
  ImVec2 local_14;
  byte local_9;
  
  local_9 = in_SIL & 1;
  ImVec2::ImVec2(&local_14,0.5,0.5);
  ImGui::PushStyleVar(in_stack_ffffffffffffff44,in_stack_ffffffffffffff38);
  pcVar3 = "ERROR";
  if ((local_9 & 1) != 0) {
    pcVar3 = "FATAL ERROR";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar3,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::c_str();
  ImGui::OpenPopup(in_stack_ffffffffffffff10);
  count = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  std::__cxx11::string::c_str();
  name = ImGui::CalcTextSize((char *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                             SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0),
                             (float)in_stack_ffffffffffffff28);
  uStack_c0 = (undefined4)extraout_XMM0_Qb;
  auVar1._8_4_ = uStack_c0;
  auVar1._0_4_ = name.x;
  auVar1._4_4_ = name.y;
  auVar1._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  local_54 = vmovlpd_avx(auVar1);
  local_60 = (float)view::windowWidth / 5.0;
  local_64 = (float)local_54 + 50.0;
  local_68 = (float)view::windowWidth * 0.5;
  pfVar4 = std::min<float>(&local_64,&local_68);
  col = (ImVec4 *)std::max<float>(&local_60,pfVar4);
  ImVec2::ImVec2(&local_5c,col->x,0.0);
  ImGui::SetNextWindowSize(&local_5c,0);
  ImVec4::ImVec4(&local_78,0.6666667,0.0,0.0,1.0);
  ImGui::PushStyleColor((ImGuiCol)((ulong)pfVar4 >> 0x20),col);
  flags = (ImGuiWindowFlags)((ulong)col >> 0x20);
  std::__cxx11::string::c_str();
  bVar2 = ImGui::BeginPopupModal((char *)name,(bool *)pfVar4,flags);
  indent_w = (float)CONCAT13(bVar2,(int3)in_stack_ffffffffffffff24);
  if (bVar2) {
    local_7c = (local_5c.x - (float)local_54) * 0.5 + -5.0;
    local_80 = 0.0;
    pfVar4 = std::max<float>(&local_7c,&local_80);
    local_7c = *pfVar4;
    local_81 = 0.0 < local_7c;
    if ((bool)local_81) {
      ImGui::Indent(indent_w);
    }
    repeat = (undefined1)((ulong)pfVar4 >> 0x38);
    uVar5 = std::__cxx11::string::c_str();
    ImGui::TextWrapped("%s",uVar5);
    if ((local_81 & 1) != 0) {
      ImGui::Unindent(indent_w);
    }
    ImGui::Spacing();
    ImGui::Spacing();
    ImGui::Spacing();
    local_88 = 120.0;
    local_8c = (local_5c.x - 120.0) * 0.5;
    local_90 = 0.0;
    pfVar4 = std::max<float>(&local_8c,&local_90);
    local_8c = *pfVar4;
    local_81 = 0.0 < local_8c;
    if ((bool)local_81) {
      ImGui::Indent(indent_w);
    }
    ImVec2::ImVec2(&local_98,local_88,0.0);
    bVar2 = ImGui::Button((char *)pfVar4,
                          (ImVec2 *)
                          CONCAT17(in_stack_ffffffffffffff0f,
                                   CONCAT16(in_stack_ffffffffffffff0e,
                                            CONCAT15(in_stack_ffffffffffffff0d,
                                                     CONCAT14(in_stack_ffffffffffffff0c,
                                                              in_stack_ffffffffffffff08)))));
    bVar6 = true;
    if (!bVar2) {
      bVar6 = ImGui::IsKeyPressed(in_stack_ffffffffffffff20,(bool)repeat);
    }
    if (bVar6 != false) {
      popContext();
      ImGui::CloseCurrentPopup();
    }
    bVar2 = ImGui::IsItemHovered((ImGuiHoveredFlags)pfVar4);
    count = (int)((ulong)pfVar4 >> 0x20);
    if (bVar2) {
      ImGui::SetTooltip("(space to dismiss)");
    }
    if ((local_81 & 1) != 0) {
      ImGui::Unindent(indent_w);
    }
  }
  ImGui::EndPopup();
  ImGui::PopStyleColor(count);
  ImGui::PopStyleVar((int)indent_w);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void buildErrorUI(std::string message, bool fatal) {

  ImGui::PushStyleVar(ImGuiStyleVar_WindowTitleAlign, ImVec2(0.5, 0.5));
  std::string errorPopupString = fatal ? "FATAL ERROR" : "ERROR";
  ImGui::OpenPopup(errorPopupString.c_str());

  // Nice size for error modal
  ImVec2 errorTextSize = ImGui::CalcTextSize(message.c_str());
  ImVec2 errorModalSize(std::max(view::windowWidth / 5.0f, std::min(errorTextSize.x + 50, view::windowWidth / 2.0f)),
                        0);

  ImGui::SetNextWindowSize(errorModalSize);
  ImGui::PushStyleColor(ImGuiCol_TitleBgActive, ImVec4(170. / 255., 0, 0, 1.0));
  if (ImGui::BeginPopupModal(errorPopupString.c_str(), NULL, ImGuiWindowFlags_NoMove)) {

    // Nice text sizing
    float offset = (errorModalSize.x - errorTextSize.x) / 2.0 - 5;
    offset = std::max(offset, 0.0f);
    bool doIndent = offset > 0;
    if (doIndent) {
      ImGui::Indent(offset);
    }

    // Make text
    ImGui::TextWrapped("%s", message.c_str());
    if (doIndent) {
      ImGui::Unindent(offset);
    }

    ImGui::Spacing();
    ImGui::Spacing();
    ImGui::Spacing();

    // Nice button sizing
    float buttonWidth = 120;
    float buttonOffset = (errorModalSize.x - buttonWidth) / 2.0;
    buttonOffset = std::max(buttonOffset, 0.0f);
    doIndent = buttonOffset > 0;
    if (doIndent) {
      ImGui::Indent(buttonOffset);
    }

    // Make a button
    if (ImGui::Button("My bad.", ImVec2(buttonWidth, 0)) || ImGui::IsKeyPressed((int)' ')) {
      popContext();
      ImGui::CloseCurrentPopup();
    }
    if (ImGui::IsItemHovered()) ImGui::SetTooltip("(space to dismiss)");

    if (doIndent) {
      ImGui::Unindent(buttonOffset);
    }
  }

  ImGui::EndPopup();
  ImGui::PopStyleColor();
  ImGui::PopStyleVar();
}